

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall
PeleLM::getDiffusivity
          (PeleLM *this,MultiFab **diffusivity,Real time,int state_comp,int dst_comp,int ncomp)

{
  MultiFab *phi_centroid;
  TimeLevel TVar1;
  int state_comp_00;
  int scomp;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> math_bc;
  Array<MultiFab_*,_3> local_48;
  
  TVar1 = amrex::AmrLevel::which_time((AmrLevel *)this,0,time);
  phi_centroid = (&(this->super_NavierStokesBase).diffn_cc)[TVar1 != AmrOldTime];
  scomp = (state_comp - (uint)(NavierStokesBase::Temp == state_comp)) + -4;
  NavierStokesBase::fetchBCArray(&math_bc,&this->super_NavierStokesBase,0,state_comp,ncomp);
  amrex::EB_interp_CellCentroid_to_FaceCentroid
            (phi_centroid,*diffusivity,diffusivity[1],diffusivity[2],scomp,dst_comp,ncomp,
             &(this->super_NavierStokesBase).super_AmrLevel.geom,&math_bc);
  local_48._M_elems[0] = *diffusivity;
  local_48._M_elems[1] = diffusivity[1];
  local_48._M_elems[2] = diffusivity[2];
  amrex::EB_set_covered_faces(&local_48,0.0);
  if (0 < zeroBndryVisc) {
    zeroBoundaryVisc(this,diffusivity,(Real)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),
                     state_comp_00,dst_comp,scomp);
  }
  if (math_bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(math_bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)math_bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)math_bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
PeleLM::getDiffusivity (MultiFab* diffusivity[AMREX_SPACEDIM],
                        const Real time,
                        const int state_comp,
                        const int dst_comp,
                        const int ncomp)
{
   BL_PROFILE("PLM::getDiffusivity()");
   AMREX_ASSERT(state_comp > Density);
   AMREX_ASSERT(diffusivity[0]->nComp() >= dst_comp+ncomp);
   AMREX_ASSERT( ( state_comp == first_spec && ncomp == NUM_SPECIES ) ||
              ( state_comp == Temp && ncomp == 1 ) );

   //
   // Select time level to work with (N or N+1)
   //
   const TimeLevel whichTime = which_time(State_Type,time);
   AMREX_ASSERT(whichTime == AmrOldTime || whichTime == AmrNewTime);

   MultiFab* diff      = (whichTime == AmrOldTime) ? diffn_cc : diffnp1_cc;

   const int offset    = AMREX_SPACEDIM + 1;          // No diffusion coeff for vels or rho
   int       diff_comp = state_comp - offset;
   if (state_comp == Temp) diff_comp -= 1;            // Because RhoH is squeezed in between.

#ifdef AMREX_USE_EB
   // EB : use EB CCentroid -> FCentroid
   auto math_bc = fetchBCArray(State_Type,state_comp,ncomp);
   EB_interp_CellCentroid_to_FaceCentroid(*diff, AMREX_D_DECL(*diffusivity[0],*diffusivity[1],*diffusivity[2]),
                                          diff_comp, dst_comp, ncomp, geom, math_bc);
   EB_set_covered_faces({AMREX_D_DECL(diffusivity[0],diffusivity[1],diffusivity[2])},0.0);

#else
   // NON-EB : simply use center_to_edge_fancy
   auto math_bc = fetchBCArray(State_Type,Temp,1);
   const Box& domain = geom.Domain();
   bool use_harmonic_avg = def_harm_avg_cen2edge ? true : false;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(*diff,TilingIfNotGPU()); mfi.isValid();++mfi)
   {
      for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
      {
         const Box ebx = mfi.nodaltilebox(dir);
         const Box& edomain = amrex::surroundingNodes(domain,dir);
         const auto& diff_c  = diff->array(mfi,diff_comp);
         const auto& diff_ed = diffusivity[dir]->array(mfi,dst_comp);
         const auto bc_lo = fpi_phys_loc(math_bc[0].lo(dir));
         const auto bc_hi = fpi_phys_loc(math_bc[0].hi(dir));
         amrex::ParallelFor(ebx, [dir, bc_lo, bc_hi, ncomp, use_harmonic_avg, diff_c, diff_ed, edomain]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            int idx[3] = {i,j,k};
            bool on_lo = ( ( bc_lo == HT_Edge ) && ( idx[dir] <= edomain.smallEnd(dir) ) );
            bool on_hi = ( ( bc_hi == HT_Edge ) && ( idx[dir] >= edomain.bigEnd(dir) ) );
            cen2edg_cpp( i, j, k, dir, ncomp, use_harmonic_avg, on_lo, on_hi, diff_c, diff_ed);
         });
      }
   }
#endif

   if (zeroBndryVisc > 0) {
      zeroBoundaryVisc(diffusivity,time,state_comp,dst_comp,ncomp);
   }
}